

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::Utils::ProgramInterface::cloneVariableForStage
          (ProgramInterface *this,Variable *variable,STAGES stage,GLchar *prefix,
          VaryingPassthrough *varying_passthrough)

{
  Variable *in_00;
  Variable *out_00;
  TestError *this_00;
  Variable *out;
  Variable *in;
  VaryingPassthrough *varying_passthrough_local;
  GLchar *prefix_local;
  STAGES stage_local;
  Variable *variable_local;
  ProgramInterface *this_local;
  
  if (variable->m_storage == VARYING_OUTPUT) {
    in_00 = cloneVariableForStage(this,variable,stage,VARYING_INPUT,prefix);
    if (stage != FRAGMENT) {
      out_00 = cloneVariableForStage(this,variable,stage,VARYING_OUTPUT,prefix);
      VaryingPassthrough::Add(varying_passthrough,stage,in_00,out_00);
    }
  }
  else {
    if (1 < variable->m_storage - UNIFORM) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                 ,0x1204);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    cloneVariableForStage(this,variable,stage,variable->m_storage,prefix);
  }
  return;
}

Assistant:

void ProgramInterface::cloneVariableForStage(const Variable& variable, Shader::STAGES stage, const GLchar* prefix,
											 VaryingPassthrough& varying_passthrough)
{
	switch (variable.m_storage)
	{
	case Variable::VARYING_OUTPUT:
	{
		Variable* in = cloneVariableForStage(variable, stage, Variable::VARYING_INPUT, prefix);

		if (Shader::FRAGMENT != stage)
		{
			Variable* out = cloneVariableForStage(variable, stage, Variable::VARYING_OUTPUT, prefix);
			varying_passthrough.Add(stage, in, out);
		}
	}
	break;
	case Variable::UNIFORM:
	case Variable::SSB:
		cloneVariableForStage(variable, stage, variable.m_storage, prefix);
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}
}